

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_uint64
drmp3_src_read_frames_ex
          (drmp3_src *pSRC,drmp3_uint64 frameCount,void *pFramesOut,drmp3_bool32 flush)

{
  uint in_ECX;
  drmp3_src *in_RDX;
  long in_RSI;
  int *in_RDI;
  drmp3_src_algorithm algorithm;
  drmp3_bool32 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int iVar1;
  drmp3_uint64 local_8;
  
  if (((in_RDI == (int *)0x0) || (in_RSI == 0)) || (in_RDX == (drmp3_src *)0x0)) {
    local_8 = 0;
  }
  else {
    iVar1 = in_RDI[3];
    if (*in_RDI == in_RDI[1]) {
      iVar1 = 0;
    }
    if (iVar1 == 0) {
      local_8 = drmp3_src_read_frames_passthrough
                          (in_RDX,(ulong)in_ECX << 0x20,(void *)(ulong)in_stack_ffffffffffffffd0,
                           in_stack_ffffffffffffffcc);
    }
    else if (iVar1 == 1) {
      local_8 = drmp3_src_read_frames_linear(pSRC,frameCount,pFramesOut,flush);
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

drmp3_uint64 drmp3_src_read_frames_ex(drmp3_src* pSRC, drmp3_uint64 frameCount, void* pFramesOut, drmp3_bool32 flush)
{
    if (pSRC == NULL || frameCount == 0 || pFramesOut == NULL) return 0;

    drmp3_src_algorithm algorithm = pSRC->config.algorithm;

    // Always use passthrough if the sample rates are the same.
    if (pSRC->config.sampleRateIn == pSRC->config.sampleRateOut) {
        algorithm = drmp3_src_algorithm_none;
    }

    // Could just use a function pointer instead of a switch for this...
    switch (algorithm)
    {
        case drmp3_src_algorithm_none:   return drmp3_src_read_frames_passthrough(pSRC, frameCount, pFramesOut, flush);
        case drmp3_src_algorithm_linear: return drmp3_src_read_frames_linear(pSRC, frameCount, pFramesOut, flush);
        default: return 0;
    }
}